

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

wchar_t * fmt::v5::internal::
          parse_arg_id<wchar_t,fmt::v5::internal::id_adapter<fmt::v5::internal::format_string_checker<wchar_t,fmt::v5::internal::error_handler,wchar_t[3],int>&,wchar_t>>
                    (wchar_t *begin,wchar_t *end,
                    id_adapter<fmt::v5::internal::format_string_checker<wchar_t,_fmt::v5::internal::error_handler,_wchar_t[3],_int>_&,_wchar_t>
                    *handler)

{
  wchar_t wVar1;
  wchar_t *pwVar2;
  uint id;
  wchar_t *local_20;
  
  wVar1 = *begin;
  local_20 = begin;
  if ((wVar1 == L'}') || (wVar1 == L':')) {
    id_adapter<fmt::v5::internal::format_string_checker<wchar_t,_fmt::v5::internal::error_handler,_wchar_t[3],_int>_&,_wchar_t>
    ::operator()(handler);
  }
  else if ((uint)(wVar1 + L'\xffffffd0') < 10) {
    id = parse_nonnegative_int<wchar_t,fmt::v5::internal::id_adapter<fmt::v5::internal::format_string_checker<wchar_t,fmt::v5::internal::error_handler,wchar_t[3],int>&,wchar_t>&>
                   (&local_20,end,handler);
    if ((local_20 == end) || ((*local_20 != L':' && (*local_20 != L'}')))) {
      id_adapter<fmt::v5::internal::format_string_checker<wchar_t,_fmt::v5::internal::error_handler,_wchar_t[3],_int>_&,_wchar_t>
      ::on_error(handler,"invalid format string");
      begin = local_20;
    }
    else {
      id_adapter<fmt::v5::internal::format_string_checker<wchar_t,_fmt::v5::internal::error_handler,_wchar_t[3],_int>_&,_wchar_t>
      ::operator()(handler,id);
      begin = local_20;
    }
  }
  else if ((wVar1 == L'_') || ((uint)((wVar1 & 0xffffffdfU) - 0x41U) < 0x1a)) {
    pwVar2 = begin + 1;
    do {
      begin = pwVar2;
      if (begin == end) {
        return begin;
      }
      wVar1 = *begin;
      pwVar2 = begin + 1;
    } while ((((uint)(wVar1 + L'\xffffffd0') < 10) || (wVar1 == L'_')) ||
            ((uint)((wVar1 & 0xffffffdfU) - 0x41U) < 0x1a));
  }
  else {
    id_adapter<fmt::v5::internal::format_string_checker<wchar_t,_fmt::v5::internal::error_handler,_wchar_t[3],_int>_&,_wchar_t>
    ::on_error(handler,"invalid format string");
  }
  return begin;
}

Assistant:

FMT_CONSTEXPR const Char *parse_arg_id(
    const Char *begin, const Char *end, IDHandler &&handler) {
  assert(begin != end);
  Char c = *begin;
  if (c == '}' || c == ':')
    return handler(), begin;
  if (c >= '0' && c <= '9') {
    unsigned index = parse_nonnegative_int(begin, end, handler);
    if (begin == end || (*begin != '}' && *begin != ':'))
      return handler.on_error("invalid format string"), begin;
    handler(index);
    return begin;
  }
  if (!is_name_start(c))
    return handler.on_error("invalid format string"), begin;
  auto it = begin;
  do {
    ++it;
  } while (it != end && (is_name_start(c = *it) || ('0' <= c && c <= '9')));
  handler(basic_string_view<Char>(begin, to_unsigned(it - begin)));
  return it;
}